

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_advsound.cpp
# Opt level: O3

bool S_CheckSound(sfxinfo_t *startsfx,sfxinfo_t *sfx,TArray<sfxinfo_t_*,_sfxinfo_t_*> *chain)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  sfxinfo_t *sfx_00;
  uint uVar5;
  FRandomSoundList *pFVar6;
  ulong uVar7;
  
  if ((sfx->field_0x30 & 2) != 0) {
    return true;
  }
  uVar5 = chain->Count;
  if (uVar5 == 0) {
    uVar4 = 0;
LAB_002f46af:
    if ((uint)uVar4 < uVar5) {
      return true;
    }
  }
  else {
    uVar4 = 0;
    do {
      if (chain->Array[uVar4] == sfx) goto LAB_002f46af;
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
  }
  TArray<sfxinfo_t_*,_sfxinfo_t_*>::Grow(chain,1);
  uVar3 = chain->Count;
  chain->Array[uVar3] = sfx;
  chain->Count = uVar3 + 1;
  uVar3 = sfx->link;
  if ((sfx->field_0x30 & 1) == 0) {
    if (uVar3 == 0xffffffff) {
LAB_002f47cb:
      bVar1 = true;
    }
    else {
      if (S_sfx.Array + uVar3 == startsfx) {
        Printf("\x1cGrecursive sound $alias found for %s:\n",(startsfx->name).Chars);
        uVar3 = chain->Count;
        if (1 < uVar3) {
          uVar4 = 1;
          do {
            Printf("\x1cI    -> %s\n",(chain->Array[uVar4]->name).Chars);
            uVar4 = uVar4 + 1;
            uVar3 = chain->Count;
          } while (uVar4 < uVar3);
        }
        if (uVar3 <= uVar5 && uVar5 - uVar3 != 0) {
          TArray<sfxinfo_t_*,_sfxinfo_t_*>::Grow(chain,uVar5 - uVar3);
        }
        chain->Count = uVar5;
        bVar1 = false;
        goto LAB_002f47d2;
      }
      bVar1 = S_CheckSound(startsfx,S_sfx.Array + uVar3,chain);
    }
  }
  else {
    if (S_rnd.Array[uVar3].NumSounds == 0) goto LAB_002f47cb;
    pFVar6 = S_rnd.Array + uVar3;
    bVar1 = true;
    uVar4 = 0;
    do {
      sfx_00 = (sfxinfo_t *)
               ((long)&((S_sfx.Array)->data).data + (ulong)((uint)pFVar6->Sounds[uVar4] * 0x50));
      if (sfx_00 == startsfx) {
        bVar1 = false;
        Printf("\x1cGrecursive sound $random found for %s:\n",(startsfx->name).Chars);
        if (1 < chain->Count) {
          uVar7 = 1;
          do {
            bVar1 = false;
            Printf("\x1cI    -> %s\n",(chain->Array[uVar7]->name).Chars);
            uVar7 = uVar7 + 1;
          } while (uVar7 < chain->Count);
        }
      }
      else {
        bVar2 = S_CheckSound(startsfx,sfx_00,chain);
        bVar1 = bVar1 != false && bVar2;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < pFVar6->NumSounds);
  }
  uVar5 = chain->Count;
LAB_002f47d2:
  if (uVar5 != 0) {
    chain->Count = uVar5 - 1;
  }
  return bVar1;
}

Assistant:

static bool S_CheckSound(sfxinfo_t *startsfx, sfxinfo_t *sfx, TArray<sfxinfo_t *> &chain)
{
	sfxinfo_t *me = sfx;
	bool success = true;
	unsigned siz = chain.Size();

	if (sfx->bPlayerReserve)
	{
		return true;
	}

	// There is a bad link in here, but let's report it only for the sound that contains the broken definition.
	// Once that sound has been disabled this one will work again.
	if (chain.Find(sfx) < chain.Size())
	{
		return true;
	}
	chain.Push(sfx);

	if (me->bRandomHeader)
	{
		const FRandomSoundList *list = &S_rnd[me->link];
		for (int i = 0; i < list->NumSounds; ++i)
		{
			auto rsfx = &S_sfx[list->Sounds[i]];
			if (rsfx == startsfx)
			{
				Printf(TEXTCOLOR_RED "recursive sound $random found for %s:\n", startsfx->name.GetChars());
				success = false;
				for (unsigned i = 1; i<chain.Size(); i++)
				{
					Printf(TEXTCOLOR_ORANGE "    -> %s\n", chain[i]->name.GetChars());
				}
			}
			else
			{
				success &= S_CheckSound(startsfx, rsfx, chain);
			}
		}
	}
	else if (me->link != sfxinfo_t::NO_LINK)
	{
		me = &S_sfx[me->link];
		if (me == startsfx)
		{
			Printf(TEXTCOLOR_RED "recursive sound $alias found for %s:\n", startsfx->name.GetChars());
			success = false;
			for (unsigned i = 1; i<chain.Size(); i++)
			{
				Printf(TEXTCOLOR_ORANGE "    -> %s\n", chain[i]->name.GetChars());
			}
			chain.Resize(siz);
		}
		else
		{
			success &= S_CheckSound(startsfx, me, chain);
		}
	}
	chain.Pop();
	return success;
}